

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,uint32 newLength)

{
  SparseArraySegmentBase **ppSVar1;
  SparseArraySegmentBase *pSVar2;
  nullptr_t local_48;
  uint local_3c;
  nullptr_t pvStack_38;
  uint32 newSegmentLength;
  Type *local_30;
  Type *prev;
  SparseArraySegmentBase *next;
  uint local_14;
  JavascriptArray *pJStack_10;
  uint32 newLength_local;
  JavascriptArray *this_local;
  
  if (newLength != (this->super_ArrayObject).length) {
    local_14 = newLength;
    pJStack_10 = this;
    ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&this->head);
    if (*ppSVar1 != EmptySegment) {
      if (local_14 == 0) {
        ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                            ((WriteBarrierPtr *)&this->head);
        (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (this,*ppSVar1,0);
        pSVar2 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
        pSVar2->length = 0;
        next = (SparseArraySegmentBase *)0x0;
        pSVar2 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&this->head);
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pSVar2->next,&next);
        SetHasNoMissingValues(this,true);
        ClearSegmentMap(this);
        InvalidateLastUsedSegment(this);
      }
      else if (local_14 < (this->super_ArrayObject).length) {
        prev = (Type *)GetBeginLookupSegment(this,local_14 - 1,true);
        local_30 = &this->head;
        while (prev != (Type *)0x0) {
          if (local_14 <= *(uint *)&prev->ptr) {
            ClearSegmentMap(this);
            pvStack_38 = (nullptr_t)0x0;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                      (local_30,&stack0xffffffffffffffc8);
            break;
          }
          if (local_14 <= (uint)(*(int *)&prev->ptr + *(int *)((long)&prev->ptr + 4))) {
            ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                                ((WriteBarrierPtr *)(prev + 2));
            if (*ppSVar1 != (SparseArraySegmentBase *)0x0) {
              ClearSegmentMap(this);
            }
            local_3c = local_14 - *(int *)&prev->ptr;
            (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x73])(this,prev,(ulong)local_3c);
            local_48 = (nullptr_t)0x0;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(prev + 2,&local_48);
            *(uint *)((long)&prev->ptr + 4) = local_3c;
            SparseArraySegmentBase::CheckLengthvsSize((SparseArraySegmentBase *)prev);
            break;
          }
          local_30 = prev + 2;
          ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                              ((WriteBarrierPtr *)(prev + 2));
          prev = (Type *)*ppSVar1;
        }
        InvalidateLastUsedSegment(this);
      }
    }
    (this->super_ArrayObject).length = local_14;
    (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  return;
}

Assistant:

void JavascriptArray::SetLength(uint32 newLength)
    {
        if (newLength == length)
            return;

        if (head == EmptySegment)
        {
            // Do nothing to the segment.
        }
        else if (newLength == 0)
        {
            this->ClearElements(head, 0);
            head->length = 0;
            head->next = nullptr;
            SetHasNoMissingValues();

            ClearSegmentMap();
            this->InvalidateLastUsedSegment();
        }
        else if (newLength < length)
        {
            // _ _ 2 3 _ _ 6 7 _ _

            // SetLength(0)
            // 0 <= left -> set *prev = null
            // SetLength(2)
            // 2 <= left -> set *prev = null
            // SetLength(3)
            // 3 !<= left; 3 <= right -> truncate to length - 1
            // SetLength(5)
            // 5 <=

            SparseArraySegmentBase* next = GetBeginLookupSegment(newLength - 1); // head, or next.left < newLength
            Field(SparseArraySegmentBase*)* prev = &head;

            while(next != nullptr)
            {
                if (newLength <= next->left)
                {
                    ClearSegmentMap(); // truncate segments, null out segmentMap
                    *prev = nullptr;
                    break;
                }
                else if (newLength <= (next->left + next->length))
                {
                    if (next->next)
                    {
                        ClearSegmentMap(); // Will truncate segments, null out segmentMap
                    }

                    uint32 newSegmentLength = newLength - next->left;
                    this->ClearElements(next, newSegmentLength);
                    next->next = nullptr;
                    next->length = newSegmentLength;
                    next->CheckLengthvsSize();
                    break;
                }
                else
                {
                    prev = &next->next;
                    next = next->next;
                }
            }
            this->InvalidateLastUsedSegment();
        }
        this->length = newLength;

#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
    }